

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property::parse_bytes(property *this,text_input_buffer *input)

{
  char cVar1;
  bool bVar2;
  uint8_t local_a5 [8];
  uint8_t val;
  string local_98;
  undefined1 local_78 [8];
  property_value v;
  text_input_buffer *input_local;
  property *this_local;
  
  v._88_8_ = input;
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 != '[') {
    __assert_fail("*input == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x185,"void dtc::fdt::property::parse_bytes(text_input_buffer &)");
  }
  text_input_buffer::operator++((text_input_buffer *)v._88_8_);
  std::__cxx11::string::string((string *)&local_98);
  property_value::property_value((property_value *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  text_input_buffer::next_token((text_input_buffer *)v._88_8_);
  do {
    bVar2 = text_input_buffer::consume((text_input_buffer *)v._88_8_,']');
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_78);
LAB_00180d0a:
      property_value::~property_value((property_value *)local_78);
      return;
    }
    bVar2 = text_input_buffer::consume_hex_byte((text_input_buffer *)v._88_8_,local_a5);
    if (!bVar2) {
      text_input_buffer::parse_error
                ((text_input_buffer *)v._88_8_,"Expected hex bytes in array of bytes");
      this->valid = false;
      goto LAB_00180d0a;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&v.string_data.field_2 + 8),local_a5);
    text_input_buffer::next_token((text_input_buffer *)v._88_8_);
  } while( true );
}

Assistant:

void
property::parse_bytes(text_input_buffer &input)
{
	assert(*input == '[');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume(']'))
	{
		{
			//FIXME: We should support
			//labels in the middle of
			//these, but we don't.
			uint8_t val;
			if (!input.consume_hex_byte(val))
			{
				input.parse_error("Expected hex bytes in array of bytes");
				valid = false;
				return;
			}
			v.byte_data.push_back(val);
			input.next_token();
		}
	}
	values.push_back(v);
}